

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

int32_t decShiftToLeast(uint8_t *uar,int32_t units,int32_t shift)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint8_t uVar8;
  uint uVar9;
  
  if (shift == 0) {
    return units;
  }
  if (units - shift == 0) {
    *uar = '\0';
    return 1;
  }
  if (shift < 0x32) {
    bVar1 = ""[shift];
    iVar7 = shift - (bVar1 - 1);
    if (iVar7 != 1) {
      bVar2 = (&DAT_0030587f)[bVar1];
      uVar3 = multies[iVar7];
      uVar9 = (uar[bVar2] >> ((byte)iVar7 & 0x1f)) * uVar3 >> 0x11;
      iVar4 = units - (uint)bVar1;
      iVar5 = -1;
      while( true ) {
        uVar8 = (uint8_t)uVar9;
        *uar = uVar8;
        if (iVar4 < 1) break;
        uVar9 = (uar[(ulong)bVar2 + 1] >> ((byte)iVar7 & 0x1f)) * uVar3 >> 0x11;
        *uar = (uar[(ulong)bVar2 + 1] - (char)DECPOWERS[iVar7] * (char)uVar9) *
               (char)DECPOWERS[1 - iVar7] + uVar8;
        if ((units - shift) + iVar5 < 1) break;
        uar = uar + 1;
        iVar5 = iVar5 + -1;
        iVar4 = iVar4 + -1;
      }
      uVar6 = (ulong)(uint)-iVar5;
      goto LAB_00249b8f;
    }
    shift = (int32_t)bVar1;
  }
  for (uVar6 = 0; uar + uVar6 + (uint)shift < uar + units; uVar6 = uVar6 + 1) {
    uar[uVar6] = uar[uVar6 + (uint)shift];
  }
LAB_00249b8f:
  return (int32_t)uVar6;
}

Assistant:

static Int decShiftToLeast(Unit *uar, Int units, Int shift) {
  Unit  *target, *up;              /* work  */
  Int   cut, count;                /* work  */
  Int   quot, rem;                 /* for division  */

  if (shift==0) return units;      /* [fastpath] nothing to do  */
  if (shift==units*DECDPUN) {      /* [fastpath] little to do  */
    *uar=0;                        /* all digits cleared gives zero  */
    return 1;                      /* leaves just the one  */
    }

  target=uar;                      /* both paths  */
  cut=MSUDIGITS(shift);
  if (cut==DECDPUN) {              /* unit-boundary case; easy  */
    up=uar+D2U(shift);
    for (; up<uar+units; target++, up++) *target=*up;
    return static_cast<int32_t>(target-uar);
    }

  /* messier  */
  up=uar+D2U(shift-cut);           /* source; correct to whole Units  */
  count=units*DECDPUN-shift;       /* the maximum new length  */
  #if DECDPUN<=4
    quot=QUOT10(*up, cut);
  #else
    quot=*up/powers[cut];
  #endif
  for (; ; target++) {
    *target=(Unit)quot;
    count-=(DECDPUN-cut);
    if (count<=0) break;
    up++;
    quot=*up;
    #if DECDPUN<=4
      quot=QUOT10(quot, cut);
      rem=*up-quot*powers[cut];
    #else
      rem=quot%powers[cut];
      quot=quot/powers[cut];
    #endif
    *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
    count-=cut;
    if (count<=0) break;
    }
  return static_cast<int32_t>(target-uar+1);
  }